

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O1

void chaiscript::dispatch::detail::
     call_func<void(*)(std::__cxx11::string&,int,char_const&),void,std::__cxx11::string&,int,char_const&,0ul,1ul,2ul>
               (undefined8 param_1,undefined8 *param_2,long *param_3,Type_Conversions_State *param_4
               )

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *pcVar3;
  
  UNRECOVERED_JUMPTABLE = (code *)*param_2;
  pbVar2 = boxed_cast<std::__cxx11::string&>((Boxed_Value *)*param_3,param_4);
  iVar1 = boxed_cast<int>((Boxed_Value *)(*param_3 + 0x10),param_4);
  pcVar3 = boxed_cast<char_const&>((Boxed_Value *)(*param_3 + 0x20),param_4);
  (*UNRECOVERED_JUMPTABLE)(pbVar2,iVar1,pcVar3);
  return;
}

Assistant:

Ret call_func(Ret (*)(Params...),
                    std::index_sequence<I...>,
                    const Callable &f,
                    [[maybe_unused]] const chaiscript::Function_Params &params,
                    [[maybe_unused]] const Type_Conversions_State &t_conversions) {
        return f(boxed_cast<Params>(params[I], &t_conversions)...);
      }